

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<char16_t>::growAppend
          (QCommonArrayOps<char16_t> *this,char16_t *b,char16_t *e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<char16_t> *old_00;
  char16_t **in_RDX;
  char16_t **in_RSI;
  QPodArrayOps<char16_t> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<char16_t> *c;
  GrowthPosition where;
  QArrayDataPointer<char16_t> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<char16_t> *)((long)in_RDX - (long)in_RSI >> 1);
    c = (QCommonArrayOps<char16_t> *)0xaaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<char16_t>,char16_t_const*>
                      ((char16_t **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<char16_t>::detachAndGrow(this_00,where,(qsizetype)in_RDI,in_RDX,old_00);
    }
    else {
      QArrayDataPointer<char16_t>::detachAndGrow(this_00,where,(qsizetype)in_RDI,in_RDX,old_00);
    }
    QPodArrayOps<char16_t>::copyAppend(in_RDI,(char16_t *)in_RDX,(char16_t *)old_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }